

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_inotify_poller.cc
# Opt level: O3

bool __thiscall RecursiveInotifyPoller::AddWatch(RecursiveInotifyPoller *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  long *plVar4;
  long *plVar5;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  iVar2 = (*this->ip_->_vptr_InotifyPoller[2])();
  if ((char)iVar2 != '\0') {
    __dirp = opendir((path->_M_dataplus)._M_p);
    if (__dirp != (DIR *)0x0) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 != (dirent *)0x0) {
        do {
          if ((pdVar3->d_type == '\x04') &&
             ((pdVar3->d_name[0] != '.' ||
              ((pdVar3->d_name[1] != '\0' &&
               ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0')))))))) {
            local_70 = local_60;
            pcVar1 = (path->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar1,pcVar1 + path->_M_string_length);
            std::__cxx11::string::append((char *)&local_70);
            plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_70,local_68,0,'\x01');
            plVar5 = plVar4 + 2;
            if ((long *)*plVar4 == plVar5) {
              local_40 = *plVar5;
              uStack_38 = (undefined4)plVar4[3];
              uStack_34 = *(undefined4 *)((long)plVar4 + 0x1c);
              local_50 = &local_40;
            }
            else {
              local_40 = *plVar5;
              local_50 = (long *)*plVar4;
            }
            local_48 = plVar4[1];
            *plVar4 = (long)plVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            (*(this->super_InotifyPoller)._vptr_InotifyPoller[2])(this,&local_50);
            if (local_50 != &local_40) {
              operator_delete(local_50,local_40 + 1);
            }
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
          }
          pdVar3 = readdir(__dirp);
        } while (pdVar3 != (dirent *)0x0);
      }
      closedir(__dirp);
    }
  }
  return (bool)(char)iVar2;
}

Assistant:

bool RecursiveInotifyPoller::AddWatch(const std::string& path) {
  // Add the path itself.
  if (!ip_->AddWatch(path))
    return false;

  // Recursive add all of its children.
  DIR* d = opendir(path.c_str());
  if (d != nullptr) {
    struct dirent* de;
    while ((de = readdir(d)) != nullptr) {
      if (de->d_type == DT_DIR && strcmp(de->d_name, ".") != 0 &&
          strcmp(de->d_name, "..") != 0)
        AddWatch(path + de->d_name + '/');
    }
    closedir(d);
  }
  return true;
}